

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O2

void __thiscall
Lib::
SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
::remove<Inferences::ALASCA::FourierMotzkinConf::Lhs>
          (SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
           *this,Lhs *key)

{
  Node *pNVar1;
  Node *ld2;
  int iVar2;
  Comparison CVar3;
  ulong uVar4;
  Node *pNVar5;
  uint uVar6;
  ulong uVar7;
  Node *pNVar8;
  bool bVar9;
  
  pNVar8 = this->_left;
  uVar4 = (ulong)this->_top;
LAB_002b454b:
  uVar6 = (int)uVar4 - 1;
  uVar4 = (ulong)uVar6;
  pNVar1 = pNVar8;
  do {
    pNVar8 = pNVar1;
    while( true ) {
      pNVar1 = pNVar8->nodes[uVar6];
      if ((pNVar1 == (Node *)0x0) ||
         (CVar3 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
                  LDComparator::compare<Inferences::ALASCA::FourierMotzkinConf::Lhs>
                            (key,&pNVar1->value), CVar3 == LESS)) goto LAB_002b454b;
      if (CVar3 == GREATER) break;
      if (CVar3 == EQUAL) {
        pNVar5 = pNVar1;
        if (uVar6 == 0) {
          uVar4 = 0;
          uVar7 = uVar4;
        }
        else {
          ld2 = pNVar1->nodes[0];
          uVar7 = uVar4;
          if (((ld2 != (Node *)0x0) && (pNVar1->nodes[uVar6] != ld2)) &&
             (CVar3 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
                      LDComparator::compare<Inferences::ALASCA::FourierMotzkinConf::Lhs>
                                (key,&ld2->value), CVar3 == EQUAL)) {
            pNVar5 = pNVar1->nodes[0];
            uVar4 = 0xffffffffffffffff;
            do {
              iVar2 = (int)uVar4;
              uVar4 = (ulong)(iVar2 + 1);
              pNVar8 = pNVar1;
              uVar7 = uVar4;
            } while (pNVar5 == pNVar1->nodes[iVar2 + 2]);
          }
        }
        while( true ) {
          pNVar8->nodes[uVar4] = pNVar5->nodes[uVar4];
          bVar9 = uVar4 == 0;
          uVar4 = uVar4 - 1;
          if (bVar9) break;
          pNVar1 = pNVar8;
          do {
            pNVar8 = pNVar1;
            pNVar1 = pNVar8->nodes[uVar4 & 0xffffffff];
          } while (pNVar8->nodes[uVar4 & 0xffffffff] != pNVar5);
        }
        deallocate(pNVar5,(uint)uVar7);
        return;
      }
    }
  } while( true );
}

Assistant:

void remove(Key key)
  {
    ASS(_top > 0);

    Node* found = 0; // found node
#if VDEBUG
    unsigned foundHeight = 0; // its height
#else
    unsigned foundHeight; // its height
#endif

    Node* left = _left;
    unsigned h = _top-1;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	ASS(h != 0); //this would mean that the value is not present in the list
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  ASS(h != 0);
	  h--;
	  break;

	case GREATER:
	  left = next;
	  break;

	case EQUAL:
	  found = next;
	  foundHeight = h;
	  if(h>0 && found->nodes[0] && found->nodes[h]!=found->nodes[0] &&
		  ValueComparator::compare(key,found->nodes[0]->value)==EQUAL) {
	    //The next element exists, contains the same value,
	    //and its height is lower that the height of this one.
	    //We'll rather delete that one, than the one we've found,
	    //because otherwise there'd be only low elements after a few
	    //deletions, which would degrade the skip list to linked list.
	    h=0;
	    while(found->nodes[0]==found->nodes[h+1]) {
	      h++;
	    }
	    left = found;
	    found = found->nodes[0];
	    foundHeight = h;
	  }
	  for(;;) {
	    left->nodes[h] = found->nodes[h];
	    if(h==0) {
	      break;
	    }
	    h--;
	    while(left->nodes[h]!=found) {
	      left=left->nodes[h];
	      ASS(ValueComparator::compare(key,left->value)!=LESS);
	    }
	  }

	  deallocate(found,foundHeight);
	  return;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }